

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

Aig_Man_t * Saig_ManDupCones(Aig_Man_t *pAig,int *pPos,int nPos)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vLeaves_00;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_4c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRoots;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Aig_Man_t *pAigNew;
  int nPos_local;
  int *pPos_local;
  Aig_Man_t *pAig_local;
  
  vLeaves_00 = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  p = Vec_PtrAlloc(100);
  for (local_4c = 0; local_4c < nPos; local_4c = local_4c + 1) {
    pAVar3 = Aig_ManCo(pAig,pPos[local_4c]);
    Vec_PtrPush(p,pAVar3);
  }
  Aig_ManIncrementTravId(pAig);
  pAVar3 = Aig_ManConst1(pAig);
  Aig_ObjSetTravIdCurrent(pAig,pAVar3);
  for (local_4c = 0; iVar1 = Vec_PtrSize(p), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_4c);
    Saig_ManDupCones_rec(pAig,pAVar3,vLeaves_00,vNodes_00,p);
  }
  iVar1 = Vec_PtrSize(vNodes_00);
  p_00 = Aig_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(pAig->pName);
  p_00->pName = pcVar4;
  pAVar3 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pAVar3;
  for (local_4c = 0; iVar2 = Vec_PtrSize(vLeaves_00), iVar1 = nPos, local_4c < iVar2;
      local_4c = local_4c + 1) {
    pvVar6 = Vec_PtrEntry(vLeaves_00,local_4c);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar3;
  }
  while (local_4c = iVar1, iVar1 = Vec_PtrSize(p), local_4c < iVar1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_4c);
    pAVar5 = Aig_ObjCreateCi(p_00);
    pAVar3 = Saig_ObjLiToLo(pAig,pAVar3);
    (pAVar3->field_5).pData = pAVar5;
    iVar1 = local_4c + 1;
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes_00,local_4c);
    pAVar5 = Aig_ObjChild0Copy(pAVar3);
    p1 = Aig_ObjChild1Copy(pAVar3);
    pAVar5 = Aig_And(p_00,pAVar5,p1);
    (pAVar3->field_5).pData = pAVar5;
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(p), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_4c);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo(p_00,pAVar3);
  }
  iVar1 = Vec_PtrSize(p);
  Aig_ManSetRegNum(p_00,iVar1 - nPos);
  Vec_PtrFree(vLeaves_00);
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(p);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManDupCones( Aig_Man_t * pAig, int * pPos, int nPos )
{
    Aig_Man_t * pAigNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Aig_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Aig_ManCo(pAig, pPos[i]) );

    // mark internal nodes
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Saig_ManDupCones_rec( pAig, pObj, vLeaves, vNodes, vRoots );

    // start the new manager
    pAigNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create PIs
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // create LOs
    Vec_PtrForEachEntryStart( Aig_Obj_t *, vRoots, pObj, i, nPos )
        Saig_ObjLiToLo(pAig, pObj)->pData = Aig_ObjCreateCi( pAigNew );
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManSetRegNum( pAigNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pAigNew;

}